

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void assign_new_filename(filemgr *file,char *new_filename)

{
  size_t sVar1;
  char *__dest;
  
  free(file->new_filename);
  if (new_filename != (char *)0x0) {
    sVar1 = strlen(new_filename);
    __dest = (char *)malloc(sVar1 + 1);
    file->new_filename = __dest;
    strcpy(__dest,new_filename);
    return;
  }
  file->new_filename = (char *)0x0;
  return;
}

Assistant:

static void assign_new_filename(struct filemgr *file, const char *new_filename)
{
    free(file->new_filename);
    if (new_filename) {
        file->new_filename = (char*)malloc(strlen(new_filename) + 1);
        strcpy(file->new_filename, new_filename);
    } else {
        file->new_filename = NULL;
    }
}